

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenPoseVideo.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s;
  double dVar1;
  Size **ppSVar2;
  char cVar3;
  undefined4 uVar4;
  long lVar5;
  _InputArray *p_Var6;
  int iVar7;
  int iVar8;
  int n;
  int iVar9;
  ulong uVar10;
  int iVar11;
  float fVar12;
  __m128 t_1;
  float fVar13;
  __m128 t;
  __m128 t_2;
  Point maxLoc;
  Mat probMap;
  Net net;
  string videoFile;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> points;
  double prob;
  Mat output;
  VideoCapture cap;
  VideoWriter video;
  Mat inpBlob;
  Mat frame;
  Mat frameCopy;
  _InputArray local_3d8;
  undefined8 uStack_3c0;
  double local_3b0;
  double local_3a8;
  float local_3a0;
  float local_39c;
  float local_398;
  float local_394;
  undefined8 local_390;
  _InputArray local_388;
  undefined8 uStack_370;
  int local_320;
  int local_31c;
  int local_318;
  int local_314;
  int local_310;
  int local_30c;
  int local_308;
  int local_304;
  int local_300;
  int local_2fc;
  int local_2f8;
  int local_2f4;
  undefined1 local_2f0 [16];
  Size local_2e0;
  char *local_2d8;
  long local_2d0 [2];
  undefined4 local_2c0 [2];
  Mat *local_2b8;
  undefined8 uStack_2b0;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> local_2a8;
  long local_290;
  double local_288 [6];
  long *local_258;
  undefined8 uStack_250;
  long local_248 [6];
  long local_218;
  long local_210;
  VideoCapture local_1f8 [48];
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  _InputArray local_180;
  int local_158;
  int local_154;
  _InputArray local_150 [4];
  _InputArray local_f0 [4];
  Mat local_90 [96];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"USAGE : ./openpose <VideoFile> ",0x1f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
  std::ostream::put('\b');
  std::ostream::flush();
  local_2e0 = (Size)local_2d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_2f0 + 0x10),"sample_video.mp4","");
  if (argc == 2) {
    __s = argv[1];
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)(local_2f0 + 0x10),0,local_2d8,(ulong)__s);
  }
  cv::VideoCapture::VideoCapture(local_1f8,(string *)(local_2f0 + 0x10),0);
  cVar3 = cv::VideoCapture::isOpened();
  if (cVar3 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Unable to connect to camera",0x1b);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'P');
    std::ostream::put('P');
    iVar7 = 1;
    std::ostream::flush();
  }
  else {
    cv::Mat::Mat((Mat *)local_f0);
    cv::Mat::Mat(local_90);
    local_3b0 = (double)cv::VideoCapture::get((int)local_1f8);
    local_3a8 = (double)cv::VideoCapture::get((int)local_1f8);
    local_150[0]._0_8_ = (long)local_150 + 0x10U;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"Output-Skeleton.avi","");
    uVar4 = cv::VideoWriter::fourcc('M','J','P','G');
    iVar9 = (int)local_3b0;
    iVar7 = (int)local_3a8;
    local_158 = iVar9;
    local_154 = iVar7;
    cv::VideoWriter::VideoWriter((VideoWriter *)0x0,&local_180,local_150,uVar4);
    if (local_150[0]._0_8_ != (long)local_150 + 0x10U) {
      operator_delete((void *)local_150[0]._0_8_,(long)local_150[0].sz + 1);
    }
    cv::dnn::dnn4_v20211004::readNetFromCaffe((string *)local_2f0,(string *)&protoFile_abi_cxx11_);
    local_39c = (float)iVar9;
    local_3a0 = (float)iVar7;
    while( true ) {
      iVar7 = cv::waitKey(1);
      if (-1 < iVar7) break;
      lVar5 = cv::getTickCount();
      cv::VideoCapture::operator>>(local_1f8,(Mat *)local_f0);
      cv::Mat::clone();
      local_290 = lVar5;
      cv::Mat::operator=(local_90,(Mat *)local_150);
      cv::Mat::~Mat((Mat *)local_150);
      local_388.sz.width = 0;
      local_388.sz.height = 0;
      local_388.flags = 0x1010000;
      local_3d8._0_8_ = (undefined1 *)0x17000000170;
      local_248[0] = 0;
      local_248[1] = 0;
      local_258 = (long *)0x0;
      uStack_250 = 0;
      local_388.obj = local_f0;
      cv::dnn::dnn4_v20211004::blobFromImage
                (local_150,0.00392156862745098,(Size_ *)&local_388,(Scalar_ *)&local_3d8,
                 SUB81((Scalar_ *)&local_258,0),false,0);
      local_3d8.sz.width = 0;
      local_3d8.sz.height = 0;
      local_3d8.flags = 0x1010000;
      local_258 = local_248;
      local_3d8.obj = local_150;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"");
      local_388.sz.width = 0;
      local_388.sz.height = 0;
      uStack_370 = 0;
      local_388._0_8_ = (Size *)0x0;
      local_388.obj = (void *)0x0;
      cv::dnn::dnn4_v20211004::Net::setInput
                ((_InputArray *)local_2f0,(string *)&local_3d8,1.0,(Scalar_ *)&local_258);
      if (local_258 != local_248) {
        operator_delete(local_258,local_248[0] + 1);
      }
      local_388.obj = (void *)0x0;
      local_388.sz = (Size)((ulong)local_388.sz & 0xffffffffffffff00);
      local_388._0_8_ = &local_388.sz;
      cv::dnn::dnn4_v20211004::Net::forward((string *)&local_258);
      if ((Size *)local_388._0_8_ != &local_388.sz) {
        operator_delete((void *)local_388._0_8_,(long)local_388.sz + 1);
      }
      local_3b0 = (double)CONCAT44(local_3b0._4_4_,*(undefined4 *)(local_218 + 8));
      local_3a8 = (double)CONCAT44(local_3a8._4_4_,*(undefined4 *)(local_218 + 0xc));
      std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
                (&local_2a8,(long)nPoints,(allocator_type *)&local_388);
      if (0 < nPoints) {
        local_394 = local_39c / (float)local_3a8._0_4_;
        local_398 = local_3a0 / (float)local_3b0._0_4_;
        uVar10 = 0;
        do {
          cv::Mat::Mat((Mat *)&local_388,local_3b0._0_4_,local_3a8._0_4_,5,
                       (void *)(*(long *)(local_210 + 8) * uVar10 + local_248[0]),0);
          local_390 = 0;
          local_3d8.sz.width = 0;
          local_3d8.sz.height = 0;
          local_3d8.flags = 0x1010000;
          local_3d8.obj = &local_388;
          p_Var6 = (_InputArray *)cv::noArray();
          cv::minMaxLoc(&local_3d8,(double *)0x0,local_288,(Point_ *)0x0,(Point_ *)&local_390,p_Var6
                       );
          fVar12 = -1.0;
          fVar13 = -1.0;
          if (0.009999999776482582 < local_288[0]) {
            uStack_2b0 = 0;
            local_2c0[0] = 0x3010000;
            local_198 = ZEXT416((uint)((float)(int)local_390 * local_394));
            iVar7 = (int)((float)(int)local_390 * local_394);
            local_1a8 = ZEXT416((uint)((float)local_390._4_4_ * local_398));
            iVar9 = (int)((float)local_390._4_4_ * local_398);
            local_3d8._0_8_ = (undefined1 **)0x0;
            local_3d8.obj = (_InputArray *)0x406fe00000000000;
            local_3d8.sz.width = 0;
            local_3d8.sz.height = 0x406fe000;
            uStack_3c0 = 0;
            local_2f8 = iVar7;
            local_2f4 = iVar9;
            local_2b8 = local_90;
            cv::circle(local_2c0,&local_2f8,8,&local_3d8,0xffffffff,8,0);
            uStack_2b0 = 0;
            local_2c0[0] = 0x3010000;
            local_2b8 = local_90;
            cv::format_abi_cxx11_((char *)&local_3d8,"%d",uVar10 & 0xffffffff);
            local_1c8 = 0;
            uStack_1c0 = 0;
            local_1b8 = 0x406fe00000000000;
            uStack_1b0 = 0;
            local_300 = iVar7;
            local_2fc = iVar9;
            cv::putText(0x9999999a,local_2c0,&local_3d8,&local_300,3,&local_1c8,2,8,0);
            if ((Size *)local_3d8._0_8_ != &local_3d8.sz) {
              operator_delete((void *)local_3d8._0_8_,(long)local_3d8.sz + 1);
            }
            fVar12 = (float)local_1a8._0_4_;
            fVar13 = (float)local_198._0_4_;
          }
          local_2a8.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10].x = (int)ROUND(fVar13);
          local_2a8.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10].y = (int)ROUND(fVar12);
          cv::Mat::~Mat((Mat *)&local_388);
          uVar10 = uVar10 + 1;
        } while ((long)uVar10 < (long)nPoints);
      }
      local_3b0 = (double)local_290;
      lVar5 = 0;
      do {
        if ((0 < local_2a8.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[POSE_PAIRS[lVar5][0]].x) &&
           (0 < local_2a8.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                _M_impl.super__Vector_impl_data._M_start[POSE_PAIRS[lVar5][0]].y)) {
          if ((0 < local_2a8.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[POSE_PAIRS[lVar5][1]].x) &&
             (0 < local_2a8.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start[POSE_PAIRS[lVar5][1]].y)) {
            local_3d8.sz.width = 0;
            local_3d8.sz.height = 0;
            local_3d8.flags = 0x3010000;
            iVar7 = (int)ROUND((float)local_2a8.
                                      super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start
                                      [POSE_PAIRS[lVar5][0]].x);
            iVar9 = (int)ROUND((float)local_2a8.
                                      super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start
                                      [POSE_PAIRS[lVar5][0]].y);
            iVar11 = (int)ROUND((float)local_2a8.
                                       super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start
                                       [POSE_PAIRS[lVar5][1]].x);
            iVar8 = (int)ROUND((float)local_2a8.
                                      super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start
                                      [POSE_PAIRS[lVar5][1]].y);
            local_388._0_8_ = (Size *)0x0;
            local_388.obj = (void *)0x406fe00000000000;
            local_388.sz.width = 0;
            local_388.sz.height = 0x406fe000;
            uStack_370 = 0;
            local_3d8.obj = local_f0;
            local_310 = iVar11;
            local_30c = iVar8;
            local_308 = iVar7;
            local_304 = iVar9;
            cv::line(&local_3d8,&local_308,&local_310,(string *)&local_388,8,8,0);
            local_3d8.sz.width = 0;
            local_3d8.sz.height = 0;
            local_3d8.flags = 0x3010000;
            local_3d8.obj = local_f0;
            local_388._0_8_ = (Size *)0x0;
            local_388.obj = (void *)0x0;
            local_388.sz.width = 0;
            local_388.sz.height = 0x406fe000;
            uStack_370 = 0;
            local_318 = iVar7;
            local_314 = iVar9;
            cv::circle(&local_3d8,&local_318,8,(string *)&local_388,0xffffffff,8,0);
            local_3d8.sz.width = 0;
            local_3d8.sz.height = 0;
            local_3d8.flags = 0x3010000;
            local_3d8.obj = local_f0;
            local_388._0_8_ = (Size *)0x0;
            local_388.obj = (void *)0x0;
            local_388.sz.width = 0;
            local_388.sz.height = 0x406fe000;
            uStack_370 = 0;
            local_320 = iVar11;
            local_31c = iVar8;
            cv::circle(&local_3d8,&local_320,8,(string *)&local_388,0xffffffff,8,0);
          }
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0xe);
      lVar5 = cv::getTickCount();
      dVar1 = (double)cv::getTickFrequency();
      local_3d8.sz.width = 0;
      local_3d8.sz.height = 0;
      local_3d8.flags = 0x3010000;
      local_3d8.obj = local_f0;
      cv::format_abi_cxx11_
                ((char *)&local_388,SUB84(((double)lVar5 - local_3b0) / dVar1,0),
                 "time taken = %.2f sec");
      local_288[1] = 1.06099789572967e-312;
      local_288[2] = 255.0;
      local_288[3] = 50.0;
      local_288[4] = 0.0;
      local_288[5] = 0.0;
      ppSVar2 = (Size **)&local_388.sz;
      cv::putText(0x9999999a,&local_3d8,(string *)&local_388,local_288 + 1,3,local_288 + 2,2,8,0);
      if ((Size **)local_388._0_8_ != ppSVar2) {
        operator_delete((void *)local_388._0_8_,(long)local_388.sz + 1);
      }
      local_388._0_8_ = ppSVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"Output-Skeleton","");
      local_3d8.sz.width = 0;
      local_3d8.sz.height = 0;
      local_3d8.flags = 0x1010000;
      local_3d8.obj = local_f0;
      cv::imshow((string *)&local_388,&local_3d8);
      if ((Size **)local_388._0_8_ != ppSVar2) {
        operator_delete((void *)local_388._0_8_,(long)local_388.sz + 1);
      }
      local_388.sz.width = 0;
      local_388.sz.height = 0;
      local_388.flags = 0x1010000;
      local_388.obj = local_f0;
      cv::VideoWriter::write(&local_180);
      if (local_2a8.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2a8.
                        super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_2a8.
                              super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2a8.
                              super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      cv::Mat::~Mat((Mat *)&local_258);
      cv::Mat::~Mat((Mat *)local_150);
    }
    cv::VideoCapture::release();
    cv::VideoWriter::release();
    cv::dnn::dnn4_v20211004::Net::~Net((Net *)local_2f0);
    cv::VideoWriter::~VideoWriter((VideoWriter *)&local_180);
    cv::Mat::~Mat(local_90);
    cv::Mat::~Mat((Mat *)local_f0);
    iVar7 = 0;
  }
  cv::VideoCapture::~VideoCapture(local_1f8);
  if (local_2e0 != (Size)local_2d0) {
    operator_delete((void *)local_2e0,local_2d0[0] + 1);
  }
  return iVar7;
}

Assistant:

int main(int argc, char **argv)
{

    cout << "USAGE : ./openpose <VideoFile> " << endl;
    
    string videoFile = "sample_video.mp4";
    // Take arguments from commmand line
    if (argc == 2)
    {   
      videoFile = argv[1];
    }

    int inWidth = 368;
    int inHeight = 368;
    float thresh = 0.01;    

    cv::VideoCapture cap(videoFile);

    if (!cap.isOpened())
    {
        cerr << "Unable to connect to camera" << endl;
        return 1;
    }
    
    Mat frame, frameCopy;
    int frameWidth = cap.get(CAP_PROP_FRAME_WIDTH);
    int frameHeight = cap.get(CAP_PROP_FRAME_HEIGHT);
    
    VideoWriter video("Output-Skeleton.avi",VideoWriter::fourcc('M','J','P','G'), 10, Size(frameWidth,frameHeight));

    Net net = readNetFromCaffe(protoFile, weightsFile);
    double t=0;
    while( waitKey(1) < 0)
    {       
        double t = (double) cv::getTickCount();

        cap >> frame;
        frameCopy = frame.clone();
        Mat inpBlob = blobFromImage(frame, 1.0 / 255, Size(inWidth, inHeight), Scalar(0, 0, 0), false, false);

        net.setInput(inpBlob);

        Mat output = net.forward();

        int H = output.size[2];
        int W = output.size[3];

        // find the position of the body parts
        vector<Point> points(nPoints);
        for (int n=0; n < nPoints; n++)
        {
            // Probability map of corresponding body's part.
            Mat probMap(H, W, CV_32F, output.ptr(0,n));

            Point2f p(-1,-1);
            Point maxLoc;
            double prob;
            minMaxLoc(probMap, 0, &prob, 0, &maxLoc);
            if (prob > thresh)
            {
                p = maxLoc;
                p.x *= (float)frameWidth / W ;
                p.y *= (float)frameHeight / H ;

                circle(frameCopy, cv::Point((int)p.x, (int)p.y), 8, Scalar(0,255,255), -1);
                cv::putText(frameCopy, cv::format("%d", n), cv::Point((int)p.x, (int)p.y), cv::FONT_HERSHEY_COMPLEX, 1.1, cv::Scalar(0, 0, 255), 2);
            }
            points[n] = p;
        }

        int nPairs = sizeof(POSE_PAIRS)/sizeof(POSE_PAIRS[0]);

        for (int n = 0; n < nPairs; n++)
        {
            // lookup 2 connected body/hand parts
            Point2f partA = points[POSE_PAIRS[n][0]];
            Point2f partB = points[POSE_PAIRS[n][1]];

            if (partA.x<=0 || partA.y<=0 || partB.x<=0 || partB.y<=0)
                continue;

            line(frame, partA, partB, Scalar(0,255,255), 8);
            circle(frame, partA, 8, Scalar(0,0,255), -1);
            circle(frame, partB, 8, Scalar(0,0,255), -1);
        }

        t = ((double)cv::getTickCount() - t)/cv::getTickFrequency();
        cv::putText(frame, cv::format("time taken = %.2f sec", t), cv::Point(50, 50), cv::FONT_HERSHEY_COMPLEX, .8, cv::Scalar(255, 50, 0), 2);
        // imshow("Output-Keypoints", frameCopy);
        imshow("Output-Skeleton", frame);
        video.write(frame);
    }
    // When everything done, release the video capture and write object
    cap.release();
    video.release();

    return 0;
}